

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
TypedExpectation<void_(const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&)>
::~TypedExpectation(TypedExpectation<void_(const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&)>
                    *this)

{
  _Function_base *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002edd70;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (_Function_base *)*ppvVar1;
    if (this_00 != (_Function_base *)0x0) {
      std::_Function_base::~_Function_base(this_00);
    }
    operator_delete(this_00,0x20);
  }
  std::_Function_base::~_Function_base((_Function_base *)&this->repeated_action_);
  MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
  ::~MatcherBase(&(this->extra_matcher_).
                  super_MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
                );
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_solitaire::cards::Card_*const_&>,_testing::Matcher<const_solitaire::cards::Card_*const_&>_>
  ::~_Tuple_impl(&(this->matchers_).
                  super__Tuple_impl<0UL,_testing::Matcher<const_solitaire::cards::Card_*const_&>,_testing::Matcher<const_solitaire::cards::Card_*const_&>_>
                );
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

~TypedExpectation() override {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }